

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cpp
# Opt level: O3

int apply_chat_template_with_error_handling
              (common_chat_templates *tmpls,LlamaData *llama_data,bool append,int *output_length,
              bool use_jinja)

{
  char *pcVar1;
  undefined8 uVar2;
  int iVar3;
  vector<char,_std::allocator<char>_> *this;
  pointer plVar4;
  string result;
  common_chat_params chat_params;
  common_chat_templates_inputs inputs;
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  int *local_1a8;
  LlamaData *local_1a0;
  common_chat_templates *local_198;
  pointer local_190;
  undefined1 local_188 [144];
  _Alloc_hider local_f8;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Alloc_hider local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  common_chat_templates_inputs local_b8;
  
  local_b8.grammar._M_dataplus._M_p = (pointer)&local_b8.grammar.field_2;
  local_b8.messages.super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.messages.super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.messages.super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.grammar._M_string_length = 0;
  local_b8.grammar.field_2._M_local_buf[0] = '\0';
  local_b8.json_schema._M_dataplus._M_p = (pointer)&local_b8.json_schema.field_2;
  local_b8.json_schema._M_string_length = 0;
  local_b8.json_schema.field_2._M_local_buf[0] = '\0';
  local_b8.add_generation_prompt = true;
  local_b8.use_jinja = true;
  local_b8.tools.super__Vector_base<common_chat_tool,_std::allocator<common_chat_tool>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.tools.super__Vector_base<common_chat_tool,_std::allocator<common_chat_tool>_>._M_impl.
  super__Vector_impl_data._M_finish._0_5_ = 0;
  local_b8.tools.super__Vector_base<common_chat_tool,_std::allocator<common_chat_tool>_>._M_impl.
  super__Vector_impl_data._M_finish._5_3_ = 0;
  local_b8.tools.super__Vector_base<common_chat_tool,_std::allocator<common_chat_tool>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_5_ = 0;
  local_b8._117_8_ = 0;
  local_b8.extract_reasoning = true;
  plVar4 = (llama_data->messages).
           super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_190 = (llama_data->messages).
              super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_1a8 = output_length;
  local_1a0 = llama_data;
  local_198 = tmpls;
  if (plVar4 != local_190) {
    do {
      local_188._8_8_ = (pointer)0x0;
      local_188[0x10] = '\0';
      local_188._32_8_ = local_188 + 0x30;
      local_188._40_8_ = (char *)0x0;
      local_188[0x30] = '\0';
      local_188._96_8_ = (pointer)0x0;
      local_188._104_8_ = (pointer)0x0;
      local_188._80_8_ = (pointer)0x0;
      local_188._88_8_ = (pointer)0x0;
      local_188._64_8_ = (pointer)0x0;
      local_188._72_8_ = (pointer)0x0;
      local_188._112_8_ = local_188 + 0x80;
      local_188._120_8_ = (pointer)0x0;
      local_188[0x80] = '\0';
      local_f8._M_p = (pointer)&local_e8;
      local_f0 = 0;
      local_e8._M_local_buf[0] = '\0';
      local_d8._M_p = (pointer)&local_c8;
      local_d0 = 0;
      local_c8._M_local_buf[0] = '\0';
      pcVar1 = plVar4->role;
      local_188._0_8_ = local_188 + 0x10;
      strlen(pcVar1);
      std::__cxx11::string::_M_replace((ulong)local_188,0,(char *)0x0,(ulong)pcVar1);
      uVar2 = local_188._40_8_;
      pcVar1 = plVar4->content;
      strlen(pcVar1);
      std::__cxx11::string::_M_replace((ulong)(local_188 + 0x20),0,(char *)uVar2,(ulong)pcVar1);
      std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::push_back
                (&local_b8.messages,(common_chat_msg *)local_188);
      common_chat_msg::~common_chat_msg((common_chat_msg *)local_188);
      plVar4 = plVar4 + 1;
    } while (plVar4 != local_190);
  }
  local_b8.use_jinja = use_jinja;
  local_b8.add_generation_prompt = append;
  common_chat_templates_apply((common_chat_params *)local_188,local_198,&local_b8);
  local_1c8 = local_1b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_188._8_8_,
             (pointer)(local_188._8_8_ + CONCAT71(local_188._17_7_,local_188[0x10])));
  this = &local_1a0->fmtted;
  std::vector<char,_std::allocator<char>_>::resize(this,local_1c0 + 1);
  memcpy((this->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
         _M_start,local_1c8,local_1c0 + 1);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_188 + 0x80));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_188 + 0x68));
  std::vector<common_grammar_trigger,_std::allocator<common_grammar_trigger>_>::~vector
            ((vector<common_grammar_trigger,_std::allocator<common_grammar_trigger>_> *)
             (local_188 + 0x50));
  if ((undefined1 *)local_188._40_8_ != local_188 + 0x38) {
    operator_delete((void *)local_188._40_8_,local_188._56_8_ + 1);
  }
  if ((undefined1 *)local_188._8_8_ != local_188 + 0x18) {
    operator_delete((void *)local_188._8_8_,local_188._24_8_ + 1);
  }
  std::vector<common_chat_tool,_std::allocator<common_chat_tool>_>::~vector(&local_b8.tools);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.json_schema._M_dataplus._M_p != &local_b8.json_schema.field_2) {
    operator_delete(local_b8.json_schema._M_dataplus._M_p,
                    CONCAT71(local_b8.json_schema.field_2._M_allocated_capacity._1_7_,
                             local_b8.json_schema.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.grammar._M_dataplus._M_p != &local_b8.grammar.field_2) {
    operator_delete(local_b8.grammar._M_dataplus._M_p,
                    CONCAT71(local_b8.grammar.field_2._M_allocated_capacity._1_7_,
                             local_b8.grammar.field_2._M_local_buf[0]) + 1);
  }
  std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::~vector(&local_b8.messages);
  if ((int)local_1c0 < 0) {
    printe("failed to apply the chat template\n");
    iVar3 = -1;
  }
  else {
    *local_1a8 = (int)local_1c0;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int apply_chat_template_with_error_handling(const common_chat_templates * tmpls, LlamaData & llama_data, const bool append, int & output_length, bool use_jinja) {
    const int new_len = apply_chat_template(tmpls, llama_data, append, use_jinja);
    if (new_len < 0) {
        printe("failed to apply the chat template\n");
        return -1;
    }

    output_length = new_len;
    return 0;
}